

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O0

size_t phosg::skip_non_whitespace(string *s,size_t offset)

{
  size_type sVar1;
  const_reference pvVar2;
  bool bVar3;
  undefined8 local_18;
  size_t offset_local;
  string *s_local;
  
  local_18 = offset;
  while( true ) {
    sVar1 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            length(s);
    bVar3 = false;
    if (local_18 < sVar1) {
      pvVar2 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[](s,local_18);
      bVar3 = false;
      if (*pvVar2 != ' ') {
        pvVar2 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 operator[](s,local_18);
        bVar3 = false;
        if (*pvVar2 != '\t') {
          pvVar2 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                   ::operator[](s,local_18);
          bVar3 = false;
          if (*pvVar2 != '\r') {
            pvVar2 = ::std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                               (s,local_18);
            bVar3 = *pvVar2 != '\n';
          }
        }
      }
    }
    if (!bVar3) break;
    local_18 = local_18 + 1;
  }
  return local_18;
}

Assistant:

size_t skip_non_whitespace(const string& s, size_t offset) {
  while (offset < s.length() &&
      (s[offset] != ' ' && s[offset] != '\t' && s[offset] != '\r' && s[offset] != '\n')) {
    offset++;
  }
  return offset;
}